

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall TArray<int,_int>::Reserve(TArray<int,_int> *this,uint amount)

{
  uint uVar1;
  
  Grow(this,amount);
  uVar1 = this->Count;
  this->Count = amount + uVar1;
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}